

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

CopyConst<char,_ElementType<0UL>_> * __thiscall
phmap::priv::internal_layout::
LayoutImpl<std::tuple<signed_char,phmap::priv::map_slot_type<std::__cxx11::string,std::__cxx11::string>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
::Pointer<0ul,char>(LayoutImpl<std::tuple<signed_char,phmap::priv::map_slot_type<std::__cxx11::string,std::__cxx11::string>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                    *this,char *p)

{
  if (((ulong)p & 7) == 0) {
    return p;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<signed char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
        using C = typename std::remove_const<Char>::type;
        static_assert(
            std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
            "The argument must be a pointer to [const] [signed|unsigned] char");
        constexpr size_t alignment = Alignment();
        (void)alignment;
        assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
        return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
    }